

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O1

void __thiscall SkipList::put(SkipList *this,uint64_t key,string *value)

{
  mt19937 *this_00;
  pointer pcVar1;
  SkipList *pSVar2;
  Node *pNVar3;
  ulong uVar4;
  unsigned_long uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Node *pNVar7;
  stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_> path;
  Node *local_d8;
  SkipList *local_d0;
  char *local_c8;
  size_type local_c0;
  char local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  char *local_a8;
  size_type local_a0;
  char local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  _Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::_M_initialize_map
            (&local_88,0);
  local_d8 = this->head;
  local_d0 = this;
  if (local_d8 != (Node *)0x0) {
    do {
      pNVar7 = local_d8->right;
      while (pNVar3 = pNVar7, pNVar3 != (Node *)0x0) {
        if (key <= pNVar3->key) {
          if ((pNVar3 != (Node *)0x0) && (pNVar3->key == key)) {
            uVar5 = local_d0->valueSize - (pNVar3->value)._M_string_length;
            local_d0->valueSize = uVar5;
            local_d0->valueSize = uVar5 + value->_M_string_length;
            do {
              std::__cxx11::string::_M_assign((string *)&pNVar3->value);
              pNVar3 = pNVar3->down;
            } while (pNVar3 != (Node *)0x0);
            goto LAB_00109a23;
          }
          break;
        }
        local_d8 = pNVar3;
        pNVar7 = pNVar3->right;
      }
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>::
        _M_push_back_aux<SkipList::Node*const&>
                  ((deque<SkipList::Node*,std::allocator<SkipList::Node*>> *)&local_88,&local_d8);
      }
      else {
        *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_d8;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      local_d8 = local_d8->down;
    } while (local_d8 != (Node *)0x0);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    uVar4 = 1;
    pNVar7 = (Node *)0x0;
  }
  else {
    this_00 = &local_d0->mt;
    pNVar7 = (Node *)0x0;
    do {
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        local_d8 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_d8 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      pNVar3 = (Node *)operator_new(0x38);
      pcVar1 = (value->_M_dataplus)._M_p;
      local_c8 = &local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar1,pcVar1 + value->_M_string_length);
      pNVar3->right = local_d8->right;
      pNVar3->down = pNVar7;
      pNVar3->key = key;
      paVar6 = &(pNVar3->value).field_2;
      (pNVar3->value)._M_dataplus._M_p = (pointer)paVar6;
      if (local_c8 == &local_b8) {
        paVar6->_M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
        *(undefined8 *)((long)&(pNVar3->value).field_2 + 8) = uStack_b0;
      }
      else {
        (pNVar3->value)._M_dataplus._M_p = local_c8;
        (pNVar3->value).field_2._M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
      }
      (pNVar3->value)._M_string_length = local_c0;
      local_c0 = 0;
      local_b8 = '\0';
      local_d8->right = pNVar3;
      pNVar7 = local_d8->right;
      local_c8 = &local_b8;
      uVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((uVar4 & 1) == 0) goto LAB_00109a0c;
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  pSVar2 = local_d0;
  if ((uVar4 & 1) != 0) {
    local_d8 = local_d0->head;
    pNVar3 = (Node *)operator_new(0x38);
    pNVar3->right = (Node *)0x0;
    pNVar3->down = (Node *)0x0;
    pNVar3->key = 0;
    (pNVar3->value)._M_dataplus._M_p = (pointer)&(pNVar3->value).field_2;
    (pNVar3->value)._M_string_length = 0;
    (pNVar3->value).field_2._M_local_buf[0] = '\0';
    pSVar2->head = pNVar3;
    pNVar3 = (Node *)operator_new(0x38);
    pcVar1 = (value->_M_dataplus)._M_p;
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,pcVar1 + value->_M_string_length);
    pNVar3->right = (Node *)0x0;
    pNVar3->down = pNVar7;
    pNVar3->key = key;
    paVar6 = &(pNVar3->value).field_2;
    (pNVar3->value)._M_dataplus._M_p = (pointer)paVar6;
    if (local_a8 == &local_98) {
      paVar6->_M_allocated_capacity = CONCAT71(uStack_97,local_98);
      *(undefined8 *)((long)&(pNVar3->value).field_2 + 8) = uStack_90;
    }
    else {
      (pNVar3->value)._M_dataplus._M_p = local_a8;
      (pNVar3->value).field_2._M_allocated_capacity = CONCAT71(uStack_97,local_98);
    }
    (pNVar3->value)._M_string_length = local_a0;
    local_a0 = 0;
    local_98 = '\0';
    pNVar7 = local_d0->head;
    pNVar7->right = pNVar3;
    pNVar7->down = local_d8;
    local_a8 = &local_98;
  }
LAB_00109a0c:
  local_d0->length = local_d0->length + 1;
  local_d0->valueSize = local_d0->valueSize + value->_M_string_length;
LAB_00109a23:
  std::_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void SkipList::put(uint64_t key, const string &value) {
  // if key exists, update the value of all nodes
  static auto update = [](Node *p, const string &value) {
    while (p) {
      p->value = value;
      p = p->down;
    }
  };

  // find the place to insert
  stack<Node *> path;
  Node *p = head;
  while (p) {
    while (p->right && p->right->key < key) p = p->right;
    // if key exists
    if (p->right && p->right->key == key) {
      valueSize -= p->right->value.size();
      valueSize += value.size();
      update(p->right, value);
      return;
    }
    path.push(p);
    p = p->down;
  }

  // insert and grow up
  bool grow = true;
  Node *down = nullptr;
  while (grow && !path.empty()) {
    p = path.top();
    path.pop();
    p->right = new Node(key, value, p->right, down);
    down = p->right;
    grow = shouldGrowUp();
  }

  // height + 1
  if (grow) {
    p = head;
    head = new Node;
    head->right = new Node(key, value, nullptr, down);
    head->down = p;
  }

  length++;
  valueSize += value.size();
}